

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

QRect * __thiscall QFbScreen::doRedraw(QFbScreen *this)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  QRect *targetRect;
  undefined8 *puVar4;
  qsizetype qVar5;
  reference ppQVar6;
  QFbBackingStore *pQVar7;
  long in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect QVar8;
  undefined1 auVar9 [16];
  QFbBackingStore *backingStore;
  int layerIndex;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  QRegion *touchedRegion;
  QRect windowIntersect;
  QRect windowRect;
  QRect rect;
  QRect screenRect;
  QRect lastCursor;
  QPoint screenOffset;
  QFbBackingStore *in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  byte in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  byte bVar10;
  QFbCursor *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  QPainter *this_00;
  QPainter *in_stack_fffffffffffffec8;
  QRect *this_01;
  int local_10c;
  undefined8 *local_100;
  long lVar11;
  QRegion local_d8 [12];
  undefined1 local_cc [16];
  undefined1 local_bc [16];
  QImage local_a8 [24];
  QRect local_90;
  QPoint local_80;
  undefined1 local_78 [16];
  QRect local_68;
  QRect local_58;
  undefined8 local_48;
  undefined8 local_40;
  QPoint local_38;
  QRect local_30;
  QRect local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.xp.m_i = -0x55555556;
  local_10.yp.m_i = -0x55555556;
  this_01 = in_RDI;
  lVar11 = in_RSI;
  local_10 = QRect::topLeft((QRect *)in_stack_fffffffffffffe98);
  this_01->x1 = -0x55555556;
  this_01->y1 = -0x55555556;
  QRegion::QRegion((QRegion *)this_01);
  if (((*(long *)(in_RSI + 0x48) != 0) &&
      (uVar3 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))(), (uVar3 & 1) != 0)) &&
     (uVar3 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb0))(), (uVar3 & 1) != 0)) {
    local_20.x2.m_i = -0x55555556;
    local_20.y2.m_i = -0x55555556;
    local_20.x1.m_i = -0x55555556;
    local_20.y1.m_i = -0x55555556;
    local_20 = QFbCursor::dirtyRect(in_stack_fffffffffffffea8);
    QRegion::operator+=((QRegion *)(in_RSI + 0x38),(QRect *)&local_20);
  }
  uVar3 = QRegion::isEmpty();
  if ((uVar3 & 1) != 0) {
    if (*(long *)(in_RSI + 0x48) == 0) goto LAB_001245dc;
    uVar3 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    if ((uVar3 & 1) == 0) goto LAB_001245dc;
  }
  if (*(long *)(in_RSI + 0x90) == 0) {
    in_stack_fffffffffffffec8 = (QPainter *)operator_new(8);
    QPainter::QPainter(in_stack_fffffffffffffec8,(QPaintDevice *)(in_RSI + 0x78));
    *(QPainter **)(in_RSI + 0x90) = in_stack_fffffffffffffec8;
  }
  local_30.x2.m_i = -0x55555556;
  local_30.y2.m_i = -0x55555556;
  local_30.x1.m_i = -0x55555556;
  local_30.y1.m_i = -0x55555556;
  targetRect = (QRect *)(in_RSI + 0x50);
  local_38 = operator-((QPoint *)
                       CONCAT17(in_stack_fffffffffffffea7,
                                CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)));
  local_30 = QRect::translated(this_01,(QPoint *)in_RDI);
  local_100 = (undefined8 *)QRegion::begin();
  puVar4 = (undefined8 *)QRegion::end();
  for (; local_100 != puVar4; local_100 = local_100 + 2) {
    local_48 = *local_100;
    local_40 = local_100[1];
    QVar8 = QRect::intersected((QRect *)CONCAT17(in_stack_fffffffffffffea7,
                                                 CONCAT16(in_stack_fffffffffffffea6,
                                                          in_stack_fffffffffffffea0)),
                               (QRect *)in_stack_fffffffffffffe98);
    local_58._0_8_ = QVar8._0_8_;
    local_48._0_4_ = local_58.x1.m_i;
    local_48._4_4_ = local_58.y1.m_i;
    local_58._8_8_ = QVar8._8_8_;
    local_40._0_4_ = local_58.x2.m_i;
    local_40._4_4_ = local_58.y2.m_i;
    local_58 = QVar8;
    bVar1 = QRect::isEmpty((QRect *)CONCAT17(in_stack_fffffffffffffea7,
                                             CONCAT16(in_stack_fffffffffffffea6,
                                                      in_stack_fffffffffffffea0)));
    if (!bVar1) {
      QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
      this_00 = *(QPainter **)(in_RSI + 0x90);
      QImage::hasAlphaChannel();
      QPainter::fillRect(this_00,(QRect *)CONCAT44(in_stack_fffffffffffffeb4,
                                                   in_stack_fffffffffffffeb0),
                         (GlobalColor)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      qVar5 = QList<QFbWindow_*>::size((QList<QFbWindow_*> *)(in_RSI + 0x20));
      local_10c = (int)qVar5;
      while (local_10c = local_10c + -1, local_10c != -1) {
        QList<QFbWindow_*>::operator[]
                  ((QList<QFbWindow_*> *)
                   CONCAT17(in_stack_fffffffffffffea7,
                            CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                   (qsizetype)in_stack_fffffffffffffe98);
        QPlatformWindow::window();
        uVar3 = QWindow::isVisible();
        if ((uVar3 & 1) != 0) {
          local_68.x2.m_i = -0x55555556;
          local_68.y2.m_i = -0x55555556;
          local_68.x1.m_i = -0x55555556;
          local_68.y1.m_i = -0x55555556;
          ppQVar6 = QList<QFbWindow_*>::operator[]
                              ((QList<QFbWindow_*> *)
                               CONCAT17(in_stack_fffffffffffffea7,
                                        CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0
                                                )),(qsizetype)in_stack_fffffffffffffe98);
          auVar9 = (**(code **)(*(long *)*ppQVar6 + 0x30))();
          local_78 = auVar9;
          local_80 = operator-((QPoint *)
                               CONCAT17(in_stack_fffffffffffffea7,
                                        CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0
                                                )));
          local_68 = QRect::translated(this_01,(QPoint *)in_RDI);
          local_90.x2.m_i = -0x55555556;
          local_90.y2.m_i = -0x55555556;
          local_90.x1.m_i = -0x55555556;
          local_90.y1.m_i = -0x55555556;
          in_stack_fffffffffffffeb4 = QRect::left((QRect *)0x1243b1);
          in_stack_fffffffffffffeb4 = -in_stack_fffffffffffffeb4;
          QRect::top((QRect *)0x1243c8);
          local_90 = QRect::translated(this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          ppQVar6 = QList<QFbWindow_*>::operator[]
                              ((QList<QFbWindow_*> *)
                               CONCAT17(in_stack_fffffffffffffea7,
                                        CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0
                                                )),(qsizetype)in_stack_fffffffffffffe98);
          pQVar7 = QFbWindow::backingStore(*ppQVar6);
          if (pQVar7 != (QFbBackingStore *)0x0) {
            QFbBackingStore::lock((QFbBackingStore *)0x12441f);
            in_stack_fffffffffffffea8 = *(QFbCursor **)(in_RSI + 0x90);
            QFbBackingStore::image(in_stack_fffffffffffffe98);
            QFlags<Qt::ImageConversionFlag>::QFlags
                      ((QFlags<Qt::ImageConversionFlag> *)
                       CONCAT17(in_stack_fffffffffffffea7,
                                CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                       (ImageConversionFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20));
            QPainter::drawImage(in_stack_fffffffffffffec8,targetRect,(QImage *)this_00,
                                (QRect *)CONCAT44(in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0),
                                (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                                SUB84((ulong)lVar11 >> 0x20,0));
            QImage::~QImage(local_a8);
            QFbBackingStore::unlock((QFbBackingStore *)0x124492);
          }
        }
      }
    }
  }
  bVar10 = 0;
  if (*(long *)(in_RSI + 0x48) != 0) {
    bVar2 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    in_stack_fffffffffffffea6 = 1;
    bVar10 = in_stack_fffffffffffffea6;
    if ((bVar2 & 1) == 0) {
      in_stack_fffffffffffffe98 = (QFbBackingStore *)(in_RSI + 0x38);
      local_bc = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb8))();
      in_stack_fffffffffffffea6 = QRegion::intersects((QRect *)in_stack_fffffffffffffe98);
      bVar10 = in_stack_fffffffffffffea6;
    }
  }
  if ((bVar10 & 1) != 0) {
    QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
    local_cc = (**(code **)(**(long **)(in_RSI + 0x48) + 0x98))
                         (*(long **)(in_RSI + 0x48),*(undefined8 *)(in_RSI + 0x90));
    QRegion::operator+=((QRegion *)this_01,(QRect *)local_cc);
  }
  QRegion::operator+=((QRegion *)this_01,(QRegion *)(in_RSI + 0x38));
  QRegion::QRegion(local_d8);
  QRegion::operator=((QRegion *)
                     CONCAT17(bVar10,CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                     (QRegion *)in_stack_fffffffffffffe98);
  QRegion::~QRegion(local_d8);
LAB_001245dc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRegion QFbScreen::doRedraw()
{
    const QPoint screenOffset = mGeometry.topLeft();

    QRegion touchedRegion;
    if (mCursor && mCursor->isDirty() && mCursor->isOnScreen()) {
        const QRect lastCursor = mCursor->dirtyRect();
        mRepaintRegion += lastCursor;
    }
    if (mRepaintRegion.isEmpty() && (!mCursor || !mCursor->isDirty()))
        return touchedRegion;

    if (!mPainter)
        mPainter = new QPainter(&mScreenImage);

    const QRect screenRect = mGeometry.translated(-screenOffset);
    for (QRect rect : mRepaintRegion) {
        rect = rect.intersected(screenRect);
        if (rect.isEmpty())
            continue;

        mPainter->setCompositionMode(QPainter::CompositionMode_Source);
        mPainter->fillRect(rect, mScreenImage.hasAlphaChannel() ? Qt::transparent : Qt::black);

        for (int layerIndex = mWindowStack.size() - 1; layerIndex != -1; layerIndex--) {
            if (!mWindowStack[layerIndex]->window()->isVisible())
                continue;

            const QRect windowRect = mWindowStack[layerIndex]->geometry().translated(-screenOffset);
            const QRect windowIntersect = rect.translated(-windowRect.left(), -windowRect.top());
            QFbBackingStore *backingStore = mWindowStack[layerIndex]->backingStore();
            if (backingStore) {
                backingStore->lock();
                mPainter->drawImage(rect, backingStore->image(), windowIntersect);
                backingStore->unlock();
            }
        }
    }

    if (mCursor && (mCursor->isDirty() || mRepaintRegion.intersects(mCursor->lastPainted()))) {
        mPainter->setCompositionMode(QPainter::CompositionMode_SourceOver);
        touchedRegion += mCursor->drawCursor(*mPainter);
    }
    touchedRegion += mRepaintRegion;
    mRepaintRegion = QRegion();

    return touchedRegion;
}